

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc,TestFactoryBase *factory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TestInfo *test_info;
  allocator<char> local_a2;
  allocator<char> local_a1;
  TestInfo *local_a0;
  string local_98;
  string local_78;
  CodeLocation local_58;
  
  local_a0 = (TestInfo *)operator_new(0x108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,test_case_name,&local_a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,name,&local_a2);
  paVar1 = &local_58.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  test_info = local_a0;
  local_58.line = code_location->line;
  TestInfo::TestInfo(local_a0,&local_78,&local_98,type_param,value_param,&local_58,fixture_class_id,
                     factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  UnitTest::GetInstance();
  UnitTestImpl::AddTestInfo(UnitTest::GetInstance::instance.impl_,set_up_tc,tear_down_tc,test_info);
  return test_info;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    CodeLocation code_location,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}